

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O2

string * __thiscall
cfd::api::json::DecodeRawTransactionRequest::GetHexString_abi_cxx11_
          (string *__return_storage_ptr__,DecodeRawTransactionRequest *this,
          DecodeRawTransactionRequest *obj)

{
  core::ConvertToString<std::__cxx11::string>
            (__return_storage_ptr__,(core *)&this->hex_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)obj);
  return __return_storage_ptr__;
}

Assistant:

static std::string GetHexString(  // line separate
      const DecodeRawTransactionRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.hex_);
  }